

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlk.cpp
# Opt level: O0

UnicodeString * __thiscall icu_63::LocaleKey::currentID(LocaleKey *this,UnicodeString *result)

{
  UBool UVar1;
  UnicodeString *result_local;
  LocaleKey *this_local;
  
  UVar1 = UnicodeString::isBogus(&this->_currentID);
  if (UVar1 == '\0') {
    UnicodeString::append(result,&this->_currentID);
  }
  return result;
}

Assistant:

UnicodeString&
LocaleKey::currentID(UnicodeString& result) const {
    if (!_currentID.isBogus()) {
        result.append(_currentID);
    }
    return result;
}